

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

void Ga2_ManStop(Ga2_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Ga2_Man_t *p_local;
  
  Vec_IntFreeP(&p->pGia->vMapping);
  Gia_ManSetPhase(p->pGia);
  if (p->pPars->fVerbose != 0) {
    uVar1 = sat_solver2_nvars(p->pSat);
    uVar2 = sat_solver2_nclauses(p->pSat);
    uVar3 = sat_solver2_nconflicts(p->pSat);
    uVar4 = sat_solver2_nlearnts(p->pSat);
    Abc_Print(1,
              "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  ObjsAdded = %d\n"
              ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,p->pSat->nDBreduces,p->nCexes,
              p->nObjAdded);
  }
  if (p->pPars->fVerbose != 0) {
    Abc_Print(1,"Hash hits = %d.  Hash misses = %d.  Hash overs = %d.  Concurrent calls = %d.\n",
              (ulong)(uint)p->nHashHit,(ulong)(uint)p->nHashMiss,(ulong)(uint)p->nHashOver,
              (ulong)(uint)p->nPdrCalls);
  }
  if (p->pSat != (sat_solver2 *)0x0) {
    sat_solver2_delete(p->pSat);
  }
  Vec_VecFree((Vec_Vec_t *)p->vCnfs);
  Vec_VecFree((Vec_Vec_t *)p->vId2Lit);
  Vec_IntFree(p->vIds);
  Vec_IntFree(p->vProofIds);
  Vec_IntFree(p->vAbs);
  Vec_IntFree(p->vValues);
  Vec_IntFree(p->vLits);
  Vec_IntFree(p->vIsopMem);
  Rnm_ManStop(p->pRnm,0);
  if (p->pTable != (int *)0x0) {
    free(p->pTable);
    p->pTable = (int *)0x0;
  }
  if (p->pSopSizes != (char *)0x0) {
    free(p->pSopSizes);
    p->pSopSizes = (char *)0x0;
  }
  if (p->pSops[1] != (char *)0x0) {
    free(p->pSops[1]);
    p->pSops[1] = (char *)0x0;
  }
  if (p->pSops != (char **)0x0) {
    free(p->pSops);
    p->pSops = (char **)0x0;
  }
  if (p != (Ga2_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Ga2_ManStop( Ga2_Man_t * p )
{
    Vec_IntFreeP( &p->pGia->vMapping );
    Gia_ManSetPhase( p->pGia );
    if ( p->pPars->fVerbose )
        Abc_Print( 1, "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  ObjsAdded = %d\n", 
            sat_solver2_nvars(p->pSat), sat_solver2_nclauses(p->pSat), 
            sat_solver2_nconflicts(p->pSat), sat_solver2_nlearnts(p->pSat), 
            p->pSat->nDBreduces, p->nCexes, p->nObjAdded );
    if ( p->pPars->fVerbose )
    Abc_Print( 1, "Hash hits = %d.  Hash misses = %d.  Hash overs = %d.  Concurrent calls = %d.\n", 
        p->nHashHit, p->nHashMiss, p->nHashOver, p->nPdrCalls );

    if( p->pSat ) sat_solver2_delete( p->pSat );
    Vec_VecFree( (Vec_Vec_t *)p->vCnfs );
    Vec_VecFree( (Vec_Vec_t *)p->vId2Lit );
    Vec_IntFree( p->vIds );
    Vec_IntFree( p->vProofIds );
    Vec_IntFree( p->vAbs );
    Vec_IntFree( p->vValues );
    Vec_IntFree( p->vLits );
    Vec_IntFree( p->vIsopMem );
    Rnm_ManStop( p->pRnm, 0 );
//    Rf2_ManStop( p->pRf2, p->pPars->fVerbose );
    ABC_FREE( p->pTable );
    ABC_FREE( p->pSopSizes );
    ABC_FREE( p->pSops[1] );
    ABC_FREE( p->pSops );
    ABC_FREE( p );
}